

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  int iVar2;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *extension;
  char *s;
  string_view filename_00;
  string_view sVar3;
  string filename;
  string local_50;
  
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    s = "text";
    extension = kWatExtension;
  }
  else if ((SVar1 == Binary) || (SVar1 == Text)) {
    s = "binary";
    extension = kWasmExtension;
  }
  else {
    s = "";
    extension = "";
  }
  iVar2 = (*module->_vptr_ScriptModule[2])(module);
  WriteLocation(this,(Location *)CONCAT44(extraout_var,iVar2));
  WriteSeparator(this);
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_(&local_50,this,extension);
  WriteKey(this,"filename");
  sVar3._M_str = extraout_RDX;
  sVar3._M_len = (size_t)local_50._M_dataplus._M_p;
  sVar3 = GetBasename((wabt *)local_50._M_string_length,sVar3);
  WriteEscapedString(this,sVar3);
  WriteSeparator(this);
  WriteKey(this,"text");
  WriteEscapedString(this,text);
  WriteSeparator(this);
  WriteKey(this,"module_type");
  WriteString(this,s);
  filename_00._M_str = local_50._M_dataplus._M_p;
  filename_00._M_len = local_50._M_string_length;
  WriteScriptModule(this,filename_00,module);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          std::string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}